

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_err cs_close(csh *handle)

{
  void *__s;
  void *pvVar1;
  long *in_RDI;
  insn_mnem *tmp;
  insn_mnem *next;
  cs_struct *ud;
  void *local_28;
  cs_err local_4;
  
  if (*in_RDI == 0) {
    local_4 = CS_ERR_CSH;
  }
  else {
    __s = (void *)*in_RDI;
    if (*(long *)((long)__s + 0x10) != 0) {
      (*cs_mem_free)(*(void **)((long)__s + 0x10));
    }
    local_28 = *(void **)((long)__s + 0xb0);
    while (local_28 != (void *)0x0) {
      pvVar1 = *(void **)((long)local_28 + 0x28);
      (*cs_mem_free)(local_28);
      local_28 = pvVar1;
    }
    (*cs_mem_free)(*(void **)((long)__s + 0x70));
    memset(__s,0,0xb8);
    (*cs_mem_free)(__s);
    *in_RDI = 0;
    local_4 = CS_ERR_OK;
  }
  return local_4;
}

Assistant:

CAPSTONE_API cs_close(csh *handle)
{
	struct cs_struct *ud;
	struct insn_mnem *next, *tmp;

	if (*handle == 0)
		// invalid handle
		return CS_ERR_CSH;

	ud = (struct cs_struct *)(*handle);

	if (ud->printer_info)
		cs_mem_free(ud->printer_info);

	// free the linked list of customized mnemonic
	tmp = ud->mnem_list;
	while(tmp) {
		next = tmp->next;
		cs_mem_free(tmp);
		tmp = next;
	}

	cs_mem_free(ud->insn_cache);

	memset(ud, 0, sizeof(*ud));
	cs_mem_free(ud);

	// invalidate this handle by ZERO out its value.
	// this is to make sure it is unusable after cs_close()
	*handle = 0;

	return CS_ERR_OK;
}